

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QPoint>::resize(QList<QPoint> *this,qsizetype size)

{
  qsizetype qVar1;
  QArrayDataPointer<QPoint> *in_RSI;
  QArrayDataPointer<QPoint> *in_RDI;
  QList<QPoint> *unaff_retaddr;
  QArrayDataPointer<QPoint> *this_00;
  
  resize_internal(unaff_retaddr,(qsizetype)in_RDI);
  this_00 = in_RSI;
  qVar1 = QList<QPoint>::size((QList<QPoint> *)in_RDI);
  if (qVar1 < (long)in_RSI) {
    QArrayDataPointer<QPoint>::operator->(in_RDI);
    QArrayDataPointer<QPoint>::appendInitialize(this_00,(qsizetype)in_RSI);
  }
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }